

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::print_shader_params_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,UsdTransform2d *shader,uint32_t indent)

{
  anon_struct_8_0_00000001_for___align aVar1;
  string *psVar2;
  uint32_t indent_00;
  uint32_t in_R8D;
  stringstream ss;
  undefined1 local_200 [32];
  undefined1 local_1e0 [40];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e0._32_8_ = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_200._0_8_ = (long)local_200 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"inputs:in","");
  indent_00 = (uint32_t)shader;
  print_typed_attr<std::array<float,2ul>>
            ((string *)local_1e0,this + 0x730,
             (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)local_200
             ,(string *)((ulong)shader & 0xffffffff),in_R8D);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_1e0._0_8_,local_1e0._8_8_);
  aVar1 = (anon_struct_8_0_00000001_for___align)((long)local_1e0 + 0x10);
  if ((anon_struct_8_0_00000001_for___align)local_1e0._0_8_ != aVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (local_200._0_8_ != (long)local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_200._0_8_ = (long)local_200 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"inputs:rotation","");
  print_typed_attr<float>
            ((string *)local_1e0,
             (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x9c8),
             (string *)local_200,indent_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_1e0._0_8_,local_1e0._8_8_);
  if ((anon_struct_8_0_00000001_for___align)local_1e0._0_8_ != aVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (local_200._0_8_ != (long)local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_200._0_8_ = (long)local_200 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"inputs:scale","");
  print_typed_attr<std::array<float,2ul>>
            ((string *)local_1e0,this + 0xc50,
             (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)local_200
             ,(string *)((ulong)shader & 0xffffffff),in_R8D);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_1e0._0_8_,local_1e0._8_8_);
  if ((anon_struct_8_0_00000001_for___align)local_1e0._0_8_ != aVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (local_200._0_8_ != (long)local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_200._0_8_ = (long)local_200 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"inputs:translation","");
  print_typed_attr<std::array<float,2ul>>
            ((string *)local_1e0,this + 0xee8,
             (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)local_200
             ,(string *)((ulong)shader & 0xffffffff),in_R8D);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_1e0._0_8_,local_1e0._8_8_);
  if ((anon_struct_8_0_00000001_for___align)local_1e0._0_8_ != aVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (local_200._0_8_ != (long)local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_200._0_8_ = (long)local_200 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"outputs:result","");
  print_typed_terminal_attr<std::array<float,2ul>>
            ((string *)local_1e0,this + 0x1180,
             (TypedTerminalAttribute<std::array<float,_2UL>_> *)local_200,
             (string *)((ulong)shader & 0xffffffff),in_R8D);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_1e0._0_8_,local_1e0._8_8_);
  if ((anon_struct_8_0_00000001_for___align)local_1e0._0_8_ != aVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (local_200._0_8_ != (long)local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  print_common_shader_params_abi_cxx11_
            ((string *)local_1e0,this,(ShaderNode *)((ulong)shader & 0xffffffff),indent_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_1e0._0_8_,local_1e0._8_8_);
  if ((anon_struct_8_0_00000001_for___align)local_1e0._0_8_ != aVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  psVar2 = (string *)std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

static std::string print_shader_params(const UsdTransform2d &shader,
                                       const uint32_t indent) {
  std::stringstream ss;

  ss << print_typed_attr(shader.in, "inputs:in", indent);
  ss << print_typed_attr(shader.rotation, "inputs:rotation", indent);
  ss << print_typed_attr(shader.scale, "inputs:scale", indent);
  ss << print_typed_attr(shader.translation, "inputs:translation", indent);
  ss << print_typed_terminal_attr(shader.result, "outputs:result", indent);

  ss << print_common_shader_params(shader, indent);

  return ss.str();
}